

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsgbmscreen.cpp
# Opt level: O0

void __thiscall QEglFSKmsGbmScreen::resetSurface(QEglFSKmsGbmScreen *this)

{
  bool bVar1;
  QKmsDevice *this_00;
  QEglFSKmsScreen *in_RDI;
  
  in_RDI[0x248] = (QEglFSKmsScreen)0x0;
  *(undefined8 *)(in_RDI + 0x238) = 0;
  *(undefined8 *)(in_RDI + 0x230) = 0;
  this_00 = (QKmsDevice *)QEglFSKmsScreen::device(in_RDI);
  bVar1 = QKmsDevice::hasAtomicSupport(this_00);
  if (!bVar1) {
    in_RDI[0x288] = (QEglFSKmsScreen)0x1;
  }
  return;
}

Assistant:

void QEglFSKmsGbmScreen::resetSurface()
{
    m_flipPending = false; // not necessarily true but enough to keep bo_next
    m_gbm_bo_current = nullptr;
    m_gbm_surface = nullptr;

    // Leave m_gbm_bo_next untouched. waitForFlip() should
    // still do its work, when called. Otherwise we end up
    // in device-is-busy errors if there is a new QWindow
    // created afterwards. (QTBUG-122663)

    // If not using atomic, will need a new drmModeSetCrtc if a new window
    // gets created later on (and so there's a new fb).
    if (!device()->hasAtomicSupport())
        needsNewModeSetForNextFb = true;
}